

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::addDecoration(Builder *this,Id id,Decoration decoration,char *s)

{
  Instruction *this_00;
  value_type local_30;
  Instruction *local_28;
  Instruction *dec;
  char *s_local;
  Decoration decoration_local;
  Id id_local;
  Builder *this_local;
  
  if (decoration != DecorationMax) {
    dec = (Instruction *)s;
    s_local._0_4_ = decoration;
    s_local._4_4_ = id;
    _decoration_local = this;
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpDecorateString);
    local_28 = this_00;
    spv::Instruction::reserveOperands(this_00,3);
    spv::Instruction::addIdOperand(local_28,s_local._4_4_);
    spv::Instruction::addImmediateOperand(local_28,(Decoration)s_local);
    spv::Instruction::addStringOperand(local_28,(char *)dec);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
               local_28);
    std::
    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::insert(&this->decorations,&local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_30);
  }
  return;
}

Assistant:

void Builder::addDecoration(Id id, Decoration decoration, const char* s)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpDecorateString);
    dec->reserveOperands(3);
    dec->addIdOperand(id);
    dec->addImmediateOperand(decoration);
    dec->addStringOperand(s);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}